

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::OnRender(CGameClient *this)

{
  IInput *pIVar1;
  CGameClient *in_RDI;
  int i;
  int local_c;
  CGameClient *this_00;
  
  this_00 = in_RDI;
  UpdatePositions(in_RDI);
  StartRendering(this_00);
  for (local_c = 0; local_c < (in_RDI->m_All).m_Num; local_c = local_c + 1) {
    (*(in_RDI->m_All).m_paComponents[local_c]->_vptr_CComponent[8])();
  }
  pIVar1 = Input(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[3])();
  CLineInput::RenderCandidates();
  return;
}

Assistant:

void CGameClient::OnRender()
{
	// update the local character and spectate position
	UpdatePositions();

	StartRendering();

	// render all systems
	for(int i = 0; i < m_All.m_Num; i++)
		m_All.m_paComponents[i]->OnRender();

	// clear all events/input for this frame
	Input()->Clear();

	CLineInput::RenderCandidates();
}